

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O0

decaf_bool_t decaf_255_scalar_eq(decaf_255_scalar_s *a,decaf_255_scalar_s *b)

{
  uint64_t uVar1;
  long in_RSI;
  long in_RDI;
  uint i;
  decaf_word_t diff;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    local_20 = *(ulong *)(in_RDI + (ulong)local_24 * 8) ^ *(ulong *)(in_RSI + (ulong)local_24 * 8) |
               local_20;
  }
  uVar1 = word_is_zero(local_20);
  return uVar1;
}

Assistant:

decaf_bool_t
API_NS(scalar_eq) (
    const scalar_t a,
    const scalar_t b
) {
    decaf_word_t diff = 0;
    unsigned int i;
    for (i=0; i<SCALAR_LIMBS; i++) {
        diff |= a->limb[i] ^ b->limb[i];
    }
    return mask_to_bool(word_is_zero(diff));
}